

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O3

void __thiscall Js::ConfigFlagsTable::EnableExperimentalFlag(ConfigFlagsTable *this)

{
  CCLock::Enter(&(this->csExperimentalFlags).super_CCLock);
  SetAsBoolean(this,WasmSimdFlag,true);
  SetAsBoolean(this,ESDynamicImportFlag,true);
  SetAsBoolean(this,ES6RegExPrototypePropertiesFlag,true);
  SetAsBoolean(this,ES6RegExSymbolsFlag,true);
  SetAsBoolean(this,ESSharedArrayBufferFlag,true);
  CCLock::Leave(&(this->csExperimentalFlags).super_CCLock);
  return;
}

Assistant:

void
    ConfigFlagsTable::EnableExperimentalFlag()
    {
        AutoCriticalSection autocs(&csExperimentalFlags);
#define FLAG_EXPERIMENTAL(type, name, ...) this->SetAsBoolean(Js::Flag::name##Flag, true);
#include "ConfigFlagsList.h"
    }